

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.h
# Opt level: O2

void __thiscall soul::FunctionBuilder::addReturn(FunctionBuilder *this)

{
  Terminator *t;
  pool_ptr<soul::heart::Block> local_10;
  
  t = &Module::allocate<soul::heart::ReturnVoid>((this->super_BlockBuilder).module)->
       super_Terminator;
  local_10.object = (Block *)0x0;
  addTerminatorStatement(this,t,&local_10);
  return;
}

Assistant:

void addReturn()
    {
        addTerminatorStatement (module.allocate<heart::ReturnVoid>(), nullptr);
    }